

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::anon_unknown_1::RboSizeCase::test(RboSizeCase *this)

{
  CallLogWrapper *this_00;
  GLint GVar1;
  GLint GVar2;
  deUint32 dVar3;
  uint reference;
  uint reference_00;
  int iVar4;
  int maxRenderbufferSize;
  GLuint renderbufferID;
  Random rnd;
  GLint local_48;
  GLuint local_44;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  local_44 = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_44);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_44);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d42,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d43,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_48 = 1;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x84e8,&local_48);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar4 = 0x1e;
  do {
    GVar1 = local_48;
    dVar3 = deRandom_getUint32(&local_40);
    GVar2 = local_48;
    reference = dVar3 % (GVar1 + 1U);
    dVar3 = deRandom_getUint32(&local_40);
    reference_00 = dVar3 % (GVar2 + 1U);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8056,reference,reference_00);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d42,reference);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d43,reference_00);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_44);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		0);
		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	0);
		expectError(GL_NO_ERROR);

		int maxRenderbufferSize = 1;
		glGetIntegerv(GL_MAX_RENDERBUFFER_SIZE, &maxRenderbufferSize);
		expectError(GL_NO_ERROR);

		const int numIterations = 30;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLint w = rnd.getInt(0, maxRenderbufferSize);
			const GLint h = rnd.getInt(0, maxRenderbufferSize);

			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, w, h);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		w);
			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	h);
		}

		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
		glDeleteRenderbuffers(1, &renderbufferID);
	}